

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O0

mraa_platform_t mraa_x86_platform(void)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  __ssize_t _Var4;
  size_t sVar5;
  char *pcVar6;
  ssize_t sVar7;
  int fd;
  FILE *fh;
  size_t len;
  char buffer [20];
  char *local_18;
  char *line;
  mraa_platform_t platform_type;
  
  line._4_4_ = MRAA_UNKNOWN_PLATFORM;
  local_18 = (char *)0x0;
  memset(&len,0,0x14);
  fh = (FILE *)0x0;
  pFVar3 = fopen("/sys/devices/virtual/dmi/id/board_name","r");
  if (pFVar3 == (FILE *)0x0) {
    pFVar3 = fopen("/proc/cmdline","r");
    if (pFVar3 != (FILE *)0x0) {
      _Var4 = getline(&local_18,(size_t *)&fh,pFVar3);
      if (_Var4 != -1) {
        pcVar6 = strstr(local_18,"sf3gr_mrd_version=P2.0");
        if (pcVar6 != (char *)0x0) {
          line._4_4_ = MRAA_INTEL_SOFIA_3GR;
          plat = mraa_intel_sofia_3gr();
        }
        free(local_18);
      }
      fclose(pFVar3);
    }
  }
  else {
    _Var4 = getline(&local_18,(size_t *)&fh,pFVar3);
    pcVar6 = local_18;
    if (_Var4 != -1) {
      sVar5 = strcspn(local_18,"\r\n");
      pcVar6[sVar5] = '\0';
      iVar1 = strncmp(local_18,"GalileoGen2",0xc);
      if ((iVar1 == 0) || (iVar1 = strncmp(local_18,"SIMATIC IOT2000",0x10), iVar1 == 0)) {
        line._4_4_ = MRAA_INTEL_GALILEO_GEN2;
        plat = mraa_intel_galileo_gen2();
      }
      else {
        iVar1 = strncmp(local_18,"BODEGA BAY",0xb);
        if (iVar1 == 0) {
          line._4_4_ = MRAA_INTEL_EDISON_FAB_C;
          plat = mraa_intel_edison_fab_c();
        }
        else {
          iVar1 = strncmp(local_18,"SALT BAY",9);
          if (iVar1 == 0) {
            line._4_4_ = MRAA_INTEL_EDISON_FAB_C;
            plat = mraa_intel_edison_fab_c();
          }
          else {
            iVar1 = strncmp(local_18,"DE3815",7);
            if (iVar1 == 0) {
              line._4_4_ = MRAA_INTEL_DE3815;
              plat = mraa_intel_de3815();
            }
            else {
              iVar1 = strncmp(local_18,"NUC5i5MYBE",0xb);
              if ((iVar1 == 0) || (iVar1 = strncmp(local_18,"NUC5i3MYBE",0xb), iVar1 == 0)) {
                line._4_4_ = MRAA_INTEL_NUC5;
                plat = mraa_intel_nuc5();
              }
              else {
                iVar1 = strncmp(local_18,"NOTEBOOK",9);
                if (iVar1 == 0) {
                  line._4_4_ = MRAA_INTEL_MINNOWBOARD_MAX;
                  plat = mraa_intel_minnowboard_byt_compatible(0);
                }
                else {
                  iVar1 = strncasecmp(local_18,"MinnowBoard MAX",0x10);
                  if (iVar1 == 0) {
                    line._4_4_ = MRAA_INTEL_MINNOWBOARD_MAX;
                    plat = mraa_intel_minnowboard_byt_compatible(0);
                  }
                  else {
                    iVar1 = strncasecmp(local_18,"Galileo",8);
                    if (iVar1 == 0) {
                      line._4_4_ = MRAA_INTEL_GALILEO_GEN1;
                      plat = mraa_intel_galileo_rev_d();
                    }
                    else {
                      iVar1 = strncasecmp(local_18,"MinnowBoard Compatible",0x17);
                      if (iVar1 == 0) {
                        line._4_4_ = MRAA_INTEL_MINNOWBOARD_MAX;
                        plat = mraa_intel_minnowboard_byt_compatible(1);
                      }
                      else {
                        iVar1 = strncasecmp(local_18,"MinnowBoard Turbot",0x13);
                        if (iVar1 == 0) {
                          line._4_4_ = MRAA_INTEL_MINNOWBOARD_MAX;
                          plat = mraa_intel_minnowboard_byt_compatible(1);
                        }
                        else {
                          iVar1 = strncasecmp(local_18,"Braswell Cherry Hill",0x15);
                          if (iVar1 == 0) {
                            line._4_4_ = MRAA_INTEL_CHERRYHILLS;
                            plat = mraa_intel_cherryhills();
                          }
                          else {
                            iVar1 = strncasecmp(local_18,"Intel Learning Kit",0x13);
                            if (iVar1 == 0) {
                              line._4_4_ = MRAA_INTEL_ILK;
                              plat = mraa_intel_ilk();
                            }
                            else {
                              iVar1 = strncasecmp(local_18,"UP-CHT01",9);
                              if (iVar1 == 0) {
                                line._4_4_ = MRAA_UP;
                                plat = mraa_up_board();
                              }
                              else {
                                iVar1 = strncasecmp(local_18,"UP-APL01",9);
                                if (iVar1 == 0) {
                                  line._4_4_ = MRAA_UP2;
                                  plat = mraa_up2_board();
                                }
                                else {
                                  iVar1 = strncasecmp(local_18,"RVP",4);
                                  if (iVar1 == 0) {
                                    line._4_4_ = MRAA_INTEL_GT_TUCHUCK;
                                    plat = mraa_joule_expansion_board();
                                  }
                                  else {
                                    iVar1 = strncasecmp(local_18,"SDS",4);
                                    if (iVar1 == 0) {
                                      line._4_4_ = MRAA_INTEL_GT_TUCHUCK;
                                      plat = mraa_joule_expansion_board();
                                    }
                                    else {
                                      iVar1 = strncasecmp(local_18,"SAF3",5);
                                      if (iVar1 == 0) {
                                        line._4_4_ = MRAA_IEI_TANK;
                                        plat = mraa_iei_tank();
                                      }
                                      else {
                                        iVar1 = strncasecmp(local_18,"LEC-ALAI",9);
                                        if (iVar1 == 0) {
                                          line._4_4_ = MRAA_ADLINK_LEC_AL;
                                          plat = mraa_lec_al_board();
                                        }
                                        else {
                                          iVar1 = strncasecmp(local_18,"LEC-AL",7);
                                          if (iVar1 == 0) {
                                            line._4_4_ = MRAA_ADLINK_LEC_AL;
                                            plat = mraa_lec_al_board();
                                          }
                                          else {
                                            iVar1 = strncasecmp(local_18,"UP-WHL01",9);
                                            if (iVar1 == 0) {
                                              line._4_4_ = MRAA_UPXTREME;
                                              plat = mraa_upxtreme_board();
                                            }
                                            else {
                                              syslog(3,"Platform not supported, not initialising");
                                              line._4_4_ = MRAA_UNKNOWN_PLATFORM;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      free(local_18);
    }
    fclose(pFVar3);
  }
  iVar1 = open("/sys/devices/virtual/dmi/id/product_name",0);
  if (iVar1 != -1) {
    syslog(3,"Checking additional Platform support for LEC-AL iPI");
    sVar7 = read(iVar1,&len,10);
    if (0 < sVar7) {
      iVar2 = strncasecmp((char *)&len,"LEC-AL-AI",9);
      if (iVar2 == 0) {
        syslog(3,"LEC-AL AI IPi found. starting MRAA");
        line._4_4_ = MRAA_ADLINK_LEC_AL_AI;
        plat = mraa_lec_al_board();
      }
      else {
        iVar2 = strncasecmp((char *)&len,"LEC-AL",6);
        if (iVar2 == 0) {
          syslog(3,"LEC-AL IPi found. starting MRAA");
          line._4_4_ = MRAA_ADLINK_LEC_AL;
          plat = mraa_lec_al_board();
        }
      }
      close(iVar1);
    }
  }
  return line._4_4_;
}

Assistant:

mraa_platform_t
mraa_x86_platform()
{
#ifndef MRAA_PLATFORM_FORCE
    mraa_platform_t platform_type = MRAA_UNKNOWN_PLATFORM;

    char* line = NULL, buffer[20] = {0};
    // let getline allocate memory for *line
    size_t len = 0;
    FILE* fh = fopen("/sys/devices/virtual/dmi/id/board_name", "r");
    int fd;

    if (fh != NULL) {
        if (getline(&line, &len, fh) != -1) {
            // Sanitize input by terminating at any of possible end of line chars
            line[strcspn(line, "\r\n")] = 0;

            if (strncmp(line, "GalileoGen2", strlen("GalileoGen2") + 1) == 0 ||
                strncmp(line, "SIMATIC IOT2000", strlen("SIMATIC IOT2000") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN2;
                plat = mraa_intel_galileo_gen2();
            } else if (strncmp(line, "BODEGA BAY", strlen("BODEGA BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "SALT BAY", strlen("SALT BAY") + 1) == 0) {
                platform_type = MRAA_INTEL_EDISON_FAB_C;
                plat = mraa_intel_edison_fab_c();
            } else if (strncmp(line, "DE3815", strlen("DE3815") + 1) == 0) {
                platform_type = MRAA_INTEL_DE3815;
                plat = mraa_intel_de3815();
            } else if (strncmp(line, "NUC5i5MYBE", strlen("NUC5i5MYBE") + 1) == 0 ||
                       strncmp(line, "NUC5i3MYBE", strlen("NUC5i3MYBE") + 1) == 0) {
                platform_type = MRAA_INTEL_NUC5;
                plat = mraa_intel_nuc5();
            } else if (strncmp(line, "NOTEBOOK", strlen("NOTEBOOK") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "MinnowBoard MAX", strlen("MinnowBoard MAX") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(0);
            } else if (strncasecmp(line, "Galileo", strlen("Galileo") + 1) == 0) {
                platform_type = MRAA_INTEL_GALILEO_GEN1;
                plat = mraa_intel_galileo_rev_d();
            } else if (strncasecmp(line, "MinnowBoard Compatible", strlen("MinnowBoard Compatible") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "MinnowBoard Turbot", strlen("MinnowBoard Turbot") + 1) == 0) {
                platform_type = MRAA_INTEL_MINNOWBOARD_MAX;
                plat = mraa_intel_minnowboard_byt_compatible(1);
            } else if (strncasecmp(line, "Braswell Cherry Hill", strlen("Braswell Cherry Hill") + 1) == 0) {
                platform_type = MRAA_INTEL_CHERRYHILLS;
                plat = mraa_intel_cherryhills();
            } else if (strncasecmp(line, "Intel Learning Kit", strlen("Intel Learning Kit") + 1) == 0) {
                platform_type = MRAA_INTEL_ILK;
                plat = mraa_intel_ilk();
            } else if (strncasecmp(line, "UP-CHT01", strlen("UP-CHT01") + 1) == 0) {
                platform_type = MRAA_UP;
                plat = mraa_up_board();
            } else if (strncasecmp(line, "UP-APL01", strlen("UP-APL01") + 1) == 0) {
                platform_type = MRAA_UP2;
                plat = mraa_up2_board();
            } else if (strncasecmp(line, "RVP", strlen("RVP") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if (strncasecmp(line, "SDS", strlen("SDS") + 1) == 0) {
                platform_type = MRAA_INTEL_JOULE_EXPANSION;
                plat = mraa_joule_expansion_board();
            } else if ((strncasecmp(line, "SAF3", strlen("SAF3") + 1) == 0) ) {
                platform_type = MRAA_IEI_TANK;
                plat = mraa_iei_tank();
            } else if ((strncasecmp(line, "LEC-ALAI", strlen("LEC-ALAI") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
	    } else if ((strncasecmp(line, "LEC-AL", strlen("LEC-AL") + 1) == 0) ) {
                platform_type = MRAA_ADLINK_LEC_AL;
                plat = mraa_lec_al_board();
            } else if (strncasecmp(line, "UP-WHL01", strlen("UP-WHL01") + 1) == 0) {
                platform_type = MRAA_UPXTREME;
                plat = mraa_upxtreme_board();
            } else {
                syslog(LOG_ERR, "Platform not supported, not initialising");
                platform_type = MRAA_UNKNOWN_PLATFORM;
            }
            free(line);
        }
        fclose(fh);
    } else {
        fh = fopen("/proc/cmdline", "r");
        if (fh != NULL) {
            if (getline(&line, &len, fh) != -1) {
                if (strstr(line, "sf3gr_mrd_version=P2.0")) {
                    platform_type = MRAA_INTEL_SOFIA_3GR;
                    plat = mraa_intel_sofia_3gr();
                }
                free(line);
            }
            fclose(fh);
        }
    }

    if( (fd = open("/sys/devices/virtual/dmi/id/product_name", O_RDONLY)) != -1) {
	    syslog(LOG_ERR, "Checking additional Platform support for LEC-AL iPI");
	    if(read(fd, buffer, 10) > 0) {
		    if ((strncasecmp(buffer, "LEC-AL-AI", strlen("LEC-AL-AI")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL AI IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL_AI;
			    plat = mraa_lec_al_board();
		    }
		    else if ((strncasecmp(buffer, "LEC-AL", strlen("LEC-AL")) == 0)) {
			    syslog(LOG_ERR, "LEC-AL IPi found. starting MRAA");
			    platform_type = MRAA_ADLINK_LEC_AL;
			    plat = mraa_lec_al_board();
		    }
		    close(fd);
	    }
    }

    return platform_type;
#else
    #if defined(xMRAA_INTEL_GALILEO_GEN2)
    plat = mraa_intel_galileo_gen2();
    #elif defined(xMRAA_INTEL_EDISON_FAB_C)
    plat = mraa_intel_edison_fab_c();
    #elif defined(xMRAA_INTEL_DE3815)
    plat = mraa_intel_de3815();
    #elif defined(xMRAA_INTEL_MINNOWBOARD_MAX)
    plat = mraa_intel_minnowboard_byt_compatible();
    #elif defined(xMRAA_INTEL_GALILEO_GEN1)
    plat = mraa_intel_galileo_rev_d();
    #elif defined(xMRAA_INTEL_NUC5)
    plat = mraa_intel_nuc5();
    #elif defined(xMRAA_INTEL_SOFIA_3GR)
    plat = mraa_intel_sofia_3gr();
    #elif defined(xMRAA_INTEL_CHERRYHILLS)
    plat = mraa_intel_cherryhills();
    #elif defined(xMRAA_UP)
    plat = mraa_up_board();
    #elif defined(xMRAA_UP2)
    plat = mraa_up2_board();
    #elif defined(xMRAA_INTEL_JOULE_EXPANSION)
    plat = mraa_joule_expansion_board();
    #elif defined(xMRAA_IEI_TANK)
    plat = mraa_iei_tank();
    #elif defined(xMRAA_UPXTREME)
    plat = mraa_upxtreme_board();
    #else
        #error "Not using a valid platform value from mraa_platform_t - cannot compile"
    #endif
    return MRAA_PLATFORM_FORCE;
#endif
}